

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.cxx
# Opt level: O2

void __thiscall
cmExportLibraryDependenciesCommand::ConstFinalPass(cmExportLibraryDependenciesCommand *this)

{
  _Hash_node_base *this_00;
  cmTargetLinkLibraryType cVar1;
  cmGlobalGenerator *this_01;
  pointer ppcVar2;
  __node_base *p_Var3;
  pointer ppVar4;
  bool bVar5;
  TargetType TVar6;
  cmGeneratedFileStream *this_02;
  cmake *pcVar7;
  pointer ppcVar8;
  string *psVar9;
  LinkLibraryVectorType *pLVar10;
  cmTarget *this_03;
  char *pcVar11;
  mapped_type *pmVar12;
  ostream *poVar13;
  _Base_ptr p_Var14;
  _Rb_tree_node_base *p_Var15;
  pointer ppVar16;
  allocator<char> local_1c1;
  __node_base *local_1c0;
  string valueNew;
  string ltValue;
  string valueOld;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsOld;
  string targetEntry;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libTypes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsNew;
  string local_90;
  string lib;
  string ltVar;
  
  if (this->Append == true) {
    libTypes._M_t._M_impl._0_4_ = 1;
    libDepsNew._M_t._M_impl._0_8_ = (this->Filename)._M_dataplus._M_p;
    std::make_unique<std::ofstream,char_const*,std::_Ios_Openmode_const&>
              ((char **)&libDepsOld,(_Ios_Openmode *)&libDepsNew);
    this_02 = (cmGeneratedFileStream *)libDepsOld._M_t._M_impl._0_8_;
  }
  else {
    this_02 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(this_02,&this->Filename,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent(this_02,true);
  }
  if (((&(this_02->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(this_02->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    pcVar7 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    this_01 = pcVar7->GlobalGenerator;
    libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header;
    libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    libDepsOld._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header;
    libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &libTypes._M_t._M_impl.super__Rb_tree_header._M_header;
    libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppcVar2 = (this_01->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (ppcVar8 = (this_01->Makefiles).
                   super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppcVar8 != ppcVar2; ppcVar8 = ppcVar8 + 1) {
      local_1c0 = &((*ppcVar8)->Targets)._M_h._M_before_begin;
      while (p_Var3 = local_1c0->_M_nxt, p_Var3 != (__node_base *)0x0) {
        this_00 = p_Var3 + 5;
        local_1c0 = p_Var3;
        TVar6 = cmTarget::GetType((cmTarget *)this_00);
        if ((0 < (int)TVar6) && (TVar6 = cmTarget::GetType((cmTarget *)this_00), (int)TVar6 < 4)) {
          psVar9 = cmTarget::GetName_abi_cxx11_((cmTarget *)this_00);
          std::__cxx11::string::string((string *)&targetEntry,(string *)psVar9);
          std::__cxx11::string::append((char *)&targetEntry);
          valueOld._M_dataplus._M_p = (pointer)&valueOld.field_2;
          valueOld._M_string_length = 0;
          valueOld.field_2._M_local_buf[0] = '\0';
          valueNew._M_dataplus._M_p = (pointer)&valueNew.field_2;
          valueNew._M_string_length = 0;
          valueNew.field_2._M_local_buf[0] = '\0';
          pLVar10 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_((cmTarget *)this_00);
          ppVar4 = (pLVar10->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar16 = (pLVar10->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar4;
              ppVar16 = ppVar16 + 1) {
            std::__cxx11::string::string((string *)&ltVar,(string *)ppVar16);
            std::__cxx11::string::append((char *)&ltVar);
            ltValue._M_dataplus._M_p = (pointer)&ltValue.field_2;
            ltValue._M_string_length = 0;
            ltValue.field_2._M_local_buf[0] = '\0';
            cVar1 = ppVar16->second;
            if (cVar1 == GENERAL_LibraryType) {
              std::__cxx11::string::append((char *)&valueNew);
LAB_00192586:
              std::__cxx11::string::assign((char *)&ltValue);
            }
            else {
              if (cVar1 == DEBUG_LibraryType) {
                std::__cxx11::string::append((char *)&valueNew);
                goto LAB_00192586;
              }
              if (cVar1 == OPTIMIZED_LibraryType) {
                std::__cxx11::string::append((char *)&valueNew);
                goto LAB_00192586;
              }
            }
            std::__cxx11::string::string((string *)&lib,(string *)ppVar16);
            this_03 = cmGlobalGenerator::FindTarget(this_01,&lib,false);
            if (this_03 != (cmTarget *)0x0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_90,"OUTPUT_NAME",&local_1c1);
              pcVar11 = cmTarget::GetProperty(this_03,&local_90);
              std::__cxx11::string::~string((string *)&local_90);
              if (pcVar11 != (char *)0x0) {
                std::__cxx11::string::assign((char *)&lib);
              }
            }
            std::__cxx11::string::append((string *)&valueOld);
            std::__cxx11::string::append((char *)&valueOld);
            std::__cxx11::string::append((string *)&valueNew);
            std::__cxx11::string::append((char *)&valueNew);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&libTypes,&ltVar);
            if (pmVar12->_M_string_length == 0) {
              std::__cxx11::string::_M_assign((string *)pmVar12);
            }
            else {
              bVar5 = std::operator!=(pmVar12,&ltValue);
              if (bVar5) {
                std::__cxx11::string::assign((char *)pmVar12);
              }
            }
            std::__cxx11::string::~string((string *)&lib);
            std::__cxx11::string::~string((string *)&ltValue);
            std::__cxx11::string::~string((string *)&ltVar);
          }
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&libDepsNew,&targetEntry);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&libDepsOld,&targetEntry);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          std::__cxx11::string::~string((string *)&valueNew);
          std::__cxx11::string::~string((string *)&valueOld);
          std::__cxx11::string::~string((string *)&targetEntry);
        }
      }
    }
    std::operator<<((ostream *)this_02,"# Generated by CMake\n\n");
    poVar13 = std::operator<<((ostream *)this_02,"if(");
    poVar13 = std::operator<<(poVar13,
                              "\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4");
    std::operator<<(poVar13,")\n");
    std::operator<<((ostream *)this_02,"  # Information for CMake 2.6 and above.\n");
    for (p_Var14 = libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var14 != &libDepsNew._M_t._M_impl.super__Rb_tree_header;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
      if (p_Var14[2]._M_parent != (_Base_ptr)0x0) {
        poVar13 = std::operator<<((ostream *)this_02,"  set(\"");
        poVar13 = std::operator<<(poVar13,(string *)(p_Var14 + 1));
        poVar13 = std::operator<<(poVar13,"\" \"");
        poVar13 = std::operator<<(poVar13,(string *)(p_Var14 + 2));
        std::operator<<(poVar13,"\")\n");
      }
    }
    std::operator<<((ostream *)this_02,"else()\n");
    std::operator<<((ostream *)this_02,"  # Information for CMake 2.4 and lower.\n");
    for (p_Var14 = libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var15 = libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        (_Rb_tree_header *)p_Var14 != &libDepsOld._M_t._M_impl.super__Rb_tree_header;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
      if (p_Var14[2]._M_parent != (_Base_ptr)0x0) {
        poVar13 = std::operator<<((ostream *)this_02,"  set(\"");
        poVar13 = std::operator<<(poVar13,(string *)(p_Var14 + 1));
        poVar13 = std::operator<<(poVar13,"\" \"");
        poVar13 = std::operator<<(poVar13,(string *)(p_Var14 + 2));
        std::operator<<(poVar13,"\")\n");
      }
    }
    for (; (_Rb_tree_header *)p_Var15 != &libTypes._M_t._M_impl.super__Rb_tree_header;
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
      bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var15 + 2),"general");
      if (bVar5) {
        poVar13 = std::operator<<((ostream *)this_02,"  set(\"");
        poVar13 = std::operator<<(poVar13,(string *)(p_Var15 + 1));
        poVar13 = std::operator<<(poVar13,"\" \"");
        poVar13 = std::operator<<(poVar13,(string *)(p_Var15 + 2));
        std::operator<<(poVar13,"\")\n");
      }
    }
    std::operator<<((ostream *)this_02,"endif()\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&libTypes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&libDepsNew._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&libDepsOld._M_t);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&libDepsOld,
                   "Error Writing ",&this->Filename);
    cmSystemTools::Error((string *)&libDepsOld);
    std::__cxx11::string::~string((string *)&libDepsOld);
    cmSystemTools::ReportLastSystemError("");
  }
  (*(this_02->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
    [1])();
  return;
}

Assistant:

void cmExportLibraryDependenciesCommand::ConstFinalPass() const
{
  // Use copy-if-different if not appending.
  std::unique_ptr<cmsys::ofstream> foutPtr;
  if (this->Append) {
    const auto openmodeApp = std::ios::app;
    foutPtr =
      cm::make_unique<cmsys::ofstream>(this->Filename.c_str(), openmodeApp);
  } else {
    std::unique_ptr<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->Filename, true));
    ap->SetCopyIfDifferent(true);
    foutPtr = std::move(ap);
  }
  std::ostream& fout = *foutPtr;

  if (!fout) {
    cmSystemTools::Error("Error Writing " + this->Filename);
    cmSystemTools::ReportLastSystemError("");
    return;
  }

  // Collect dependency information about all library targets built in
  // the project.
  cmake* cm = this->Makefile->GetCMakeInstance();
  cmGlobalGenerator* global = cm->GetGlobalGenerator();
  const std::vector<cmMakefile*>& locals = global->GetMakefiles();
  std::map<std::string, std::string> libDepsOld;
  std::map<std::string, std::string> libDepsNew;
  std::map<std::string, std::string> libTypes;
  for (cmMakefile* local : locals) {
    for (auto const& tgt : local->GetTargets()) {
      // Get the current target.
      cmTarget const& target = tgt.second;

      // Skip non-library targets.
      if (target.GetType() < cmStateEnums::STATIC_LIBRARY ||
          target.GetType() > cmStateEnums::MODULE_LIBRARY) {
        continue;
      }

      // Construct the dependency variable name.
      std::string targetEntry = target.GetName();
      targetEntry += "_LIB_DEPENDS";

      // Construct the dependency variable value with the direct link
      // dependencies.
      std::string valueOld;
      std::string valueNew;
      cmTarget::LinkLibraryVectorType const& libs =
        target.GetOriginalLinkLibraries();
      for (cmTarget::LibraryID const& li : libs) {
        std::string ltVar = li.first;
        ltVar += "_LINK_TYPE";
        std::string ltValue;
        switch (li.second) {
          case GENERAL_LibraryType:
            valueNew += "general;";
            ltValue = "general";
            break;
          case DEBUG_LibraryType:
            valueNew += "debug;";
            ltValue = "debug";
            break;
          case OPTIMIZED_LibraryType:
            valueNew += "optimized;";
            ltValue = "optimized";
            break;
        }
        std::string lib = li.first;
        if (cmTarget* libtgt = global->FindTarget(lib)) {
          // Handle simple output name changes.  This command is
          // deprecated so we do not support full target name
          // translation (which requires per-configuration info).
          if (const char* outname = libtgt->GetProperty("OUTPUT_NAME")) {
            lib = outname;
          }
        }
        valueOld += lib;
        valueOld += ";";
        valueNew += lib;
        valueNew += ";";

        std::string& ltEntry = libTypes[ltVar];
        if (ltEntry.empty()) {
          ltEntry = ltValue;
        } else if (ltEntry != ltValue) {
          ltEntry = "general";
        }
      }
      libDepsNew[targetEntry] = valueNew;
      libDepsOld[targetEntry] = valueOld;
    }
  }

  // Generate dependency information for both old and new style CMake
  // versions.
  const char* vertest =
    "\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4";
  fout << "# Generated by CMake\n\n";
  fout << "if(" << vertest << ")\n";
  fout << "  # Information for CMake 2.6 and above.\n";
  for (auto const& i : libDepsNew) {
    if (!i.second.empty()) {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  fout << "else()\n";
  fout << "  # Information for CMake 2.4 and lower.\n";
  for (auto const& i : libDepsOld) {
    if (!i.second.empty()) {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  for (auto const& i : libTypes) {
    if (i.second != "general") {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  fout << "endif()\n";
}